

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O1

void __thiscall double_conversion::Bignum::AddUInt64(Bignum *this,uint64_t operand)

{
  long lVar1;
  bool bVar2;
  Bignum other;
  Bignum local_204;
  
  if (operand != 0) {
    lVar1 = 0;
    do {
      local_204.bigits_buffer_[lVar1] = (uint)operand & 0xfffffff;
      lVar1 = lVar1 + 1;
      bVar2 = 0xfffffff < operand;
      operand = operand >> 0x1c;
    } while (bVar2);
    local_204.exponent_ = 0;
    local_204.used_bigits_ = (ushort)lVar1;
    AddBignum(this,&local_204);
  }
  return;
}

Assistant:

void Bignum::AddUInt64(const uint64_t operand) {
  if (operand == 0) {
    return;
  }
  Bignum other;
  other.AssignUInt64(operand);
  AddBignum(other);
}